

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_grouping_function.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformGroupingFunction(Transformer *this,PGGroupingFunc *grouping)

{
  pointer pOVar1;
  type expr;
  idx_t in_RDX;
  long lVar2;
  _Tuple_impl<0UL,_duckdb::OperatorExpression_*,_std::default_delete<duckdb::OperatorExpression>_>
  local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  idx_t local_38;
  
  local_48 = 0x66;
  local_40._M_head_impl = (ParsedExpression *)this;
  make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType>
            ((duckdb *)&local_50,(ExpressionType *)&stack0xffffffffffffffb8);
  lVar2 = *(long *)(in_RDX + 8);
  local_38 = in_RDX;
  while (lVar2 = *(long *)(lVar2 + 8), lVar2 != 0) {
    pOVar1 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
             ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                           *)&local_50);
    TransformExpression((Transformer *)&stack0xffffffffffffffb8,
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)grouping);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pOVar1->children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&stack0xffffffffffffffb8);
    if ((long *)CONCAT71(uStack_47,local_48) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_47,local_48) + 8))();
    }
  }
  expr = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
         ::operator*((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                      *)&local_50);
  SetQueryLocation(&expr->super_ParsedExpression,*(int *)(local_38 + 0x24));
  *(_Head_base<0UL,_duckdb::OperatorExpression_*,_false> *)local_40._M_head_impl =
       local_50.super__Head_base<0UL,_duckdb::OperatorExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )local_40._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformGroupingFunction(duckdb_libpgquery::PGGroupingFunc &grouping) {
	auto op = make_uniq<OperatorExpression>(ExpressionType::GROUPING_FUNCTION);
	for (auto node = grouping.args->head; node; node = node->next) {
		auto n = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);
		op->children.push_back(TransformExpression(n));
	}
	SetQueryLocation(*op, grouping.location);
	return std::move(op);
}